

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O1

void canvas_savetofile(_glist *x,t_symbol *filename,t_symbol *dir,float fdestroy)

{
  t_dataslot *ptVar1;
  undefined8 uVar2;
  char *pcVar3;
  _glist *x_00;
  int iVar4;
  _binbuf *x_01;
  long lVar5;
  t_template *ptVar6;
  t_symbol *ptVar7;
  t_symbol *ptVar8;
  int *piVar9;
  char *pcVar10;
  int in_ECX;
  char *pcVar11;
  long lVar12;
  t_symbol **pptVar13;
  t_symbol **templatevec;
  int ntemplates;
  t_symbol **local_68;
  t_symbol *local_60;
  t_symbol *local_58;
  _glist *local_50;
  t_symbol **local_48;
  long local_40;
  int local_34;
  
  local_60 = filename;
  local_58 = dir;
  x_01 = binbuf_new();
  local_68 = (t_symbol **)getbytes(0);
  local_34 = 0;
  local_50 = x;
  canvas_collecttemplatesfor(x,&local_34,&local_68,in_ECX);
  lVar5 = (long)local_34;
  if (0 < lVar5) {
    lVar12 = 0;
    local_48 = local_68;
    pptVar13 = local_68;
    do {
      ptVar6 = template_findbyname(pptVar13[lVar12]);
      if (ptVar6 == (t_template *)0x0) {
        bug("canvas_savetemplatesto");
      }
      else {
        iVar4 = ptVar6->t_n;
        ptVar7 = gensym("struct");
        local_40 = lVar12;
        ptVar8 = gensym(pptVar13[lVar12]->s_name + 3);
        binbuf_addv(x_01,"sss",&s__N,ptVar7,ptVar8);
        if (0 < (long)iVar4) {
          lVar12 = 0;
          do {
            ptVar7 = &s_float;
            switch(*(undefined4 *)((long)&ptVar6->t_vec->ds_type + lVar12)) {
            case 0:
              break;
            case 1:
              ptVar7 = &s_symbol;
              break;
            case 2:
              pcVar11 = "text";
              goto LAB_00152bf7;
            case 3:
              pcVar11 = "array";
LAB_00152bf7:
              ptVar7 = gensym(pcVar11);
              break;
            default:
              bug("canvas_write");
              ptVar7 = &s_float;
            }
            ptVar1 = ptVar6->t_vec;
            uVar2 = *(undefined8 *)((long)&ptVar1->ds_name + lVar12);
            if (*(int *)((long)&ptVar1->ds_type + lVar12) == 3) {
              ptVar8 = gensym((char *)(**(long **)((long)&ptVar1->ds_arraytemplate + lVar12) + 3));
              binbuf_addv(x_01,"sss",ptVar7,uVar2,ptVar8);
            }
            else {
              binbuf_addv(x_01,"ss",ptVar7);
            }
            lVar12 = lVar12 + 0x18;
          } while ((long)iVar4 * 0x18 != lVar12);
        }
        binbuf_addsemi(x_01);
        lVar12 = local_40;
        pptVar13 = local_48;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar5);
  }
  freebytes(local_68,lVar5 << 3);
  x_00 = local_50;
  canvas_saveto(local_50,x_01);
  piVar9 = __errno_location();
  ptVar8 = local_58;
  ptVar7 = local_60;
  *piVar9 = 0;
  iVar4 = binbuf_write(x_01,local_60->s_name,local_58->s_name,0);
  if (iVar4 == 0) {
    if (x_00->gl_owner == (_glist *)0x0) {
      canvas_rename(x_00,ptVar7,ptVar8);
      canvas_updatewindowlist();
    }
    post("saved to: %s/%s",ptVar8->s_name,ptVar7->s_name);
    canvas_dirty(x_00,0.0);
    canvas_reload(ptVar7,ptVar8,x_00);
    if ((fdestroy != 0.0) || (NAN(fdestroy))) {
      ptVar7 = gensym("menuclose");
      pd_vmess((t_pd *)x_00,ptVar7,"f",0x3ff0000000000000);
    }
  }
  else {
    pcVar11 = ptVar8->s_name;
    pcVar3 = ptVar7->s_name;
    if (*piVar9 == 0) {
      pcVar10 = "write failed";
    }
    else {
      pcVar10 = strerror(*piVar9);
    }
    post("%s/%s: %s",pcVar11,pcVar3,pcVar10);
  }
  binbuf_free(x_01);
  return;
}

Assistant:

static void canvas_savetofile(t_canvas *x, t_symbol *filename, t_symbol *dir,
    float fdestroy)
{
    t_binbuf *b = binbuf_new();
    canvas_savetemplatesto(x, b, 1);
    canvas_saveto(x, b);
    errno = 0;
    if (binbuf_write(b, filename->s_name, dir->s_name, 0))
        post("%s/%s: %s", dir->s_name, filename->s_name,
            (errno ? strerror(errno) : "write failed"));
    else
    {
            /* if not an abstraction, reset title bar and directory */
        if (!x->gl_owner)
{
            canvas_rename(x, filename, dir);
            /* update window list in case Save As changed the window name */
            canvas_updatewindowlist();
}
        post("saved to: %s/%s", dir->s_name, filename->s_name);
        canvas_dirty(x, 0);
        canvas_reload(filename, dir, x);
        if (fdestroy != 0)
            vmess(&x->gl_pd, gensym("menuclose"), "f", 1.);
    }
    binbuf_free(b);
}